

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::SerializedShaderImpl> *this,
          RefCntAutoPtr<Diligent::SerializedShaderImpl> *AutoPtr)

{
  SerializedShaderImpl *this_00;
  
  this_00 = AutoPtr->m_pObject;
  this->m_pObject = this_00;
  if (this_00 != (SerializedShaderImpl *)0x0) {
    RefCountedObject<Diligent::ISerializedShader>::AddRef
              ((RefCountedObject<Diligent::ISerializedShader> *)this_00);
  }
  return;
}

Assistant:

RefCntAutoPtr(const RefCntAutoPtr& AutoPtr) noexcept :
        m_pObject{AutoPtr.m_pObject}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }